

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_rescale(secp256k1_gej *r,secp256k1_fe *s)

{
  secp256k1_fe *r_00;
  uint64_t uVar1;
  uint64_t uVar2;
  undefined8 a;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  secp256k1_gej *psVar14;
  secp256k1_gej *psVar15;
  secp256k1_gej *a_00;
  secp256k1_modinv64_modinfo *modinfo;
  secp256k1_gej *psVar16;
  secp256k1_gej *psVar17;
  secp256k1_gej *a_01;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  uint64_t *puVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  secp256k1_gej *psVar25;
  undefined1 *unaff_R13;
  ulong uVar26;
  uint64_t uVar27;
  undefined1 *puVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  secp256k1_fe zz;
  secp256k1_gej *psStack_2c0;
  secp256k1_gej *psStack_2b8;
  uint64_t uStack_2a0;
  uint64_t uStack_298;
  ulong uStack_290;
  ulong uStack_288;
  ulong uStack_280;
  undefined1 auStack_278 [96];
  ulong uStack_218;
  secp256k1_gej *psStack_210;
  undefined1 auStack_208 [56];
  ulong uStack_1d0;
  ulong uStack_1c8;
  secp256k1_gej *psStack_1c0;
  undefined1 auStack_1b8 [96];
  secp256k1_gej *psStack_158;
  undefined1 *puStack_150;
  secp256k1_gej *psStack_148;
  undefined1 *puStack_140;
  code *pcStack_138;
  secp256k1_gej *psStack_130;
  secp256k1_gej *psStack_120;
  undefined1 auStack_110 [152];
  undefined8 uStack_78;
  secp256k1_fe local_50;
  
  psVar25 = (secp256k1_gej *)0x1000003d0;
  secp256k1_gej_verify(r);
  secp256k1_fe_verify(s);
  secp256k1_fe_verify(s);
  uVar5 = (s->n[4] >> 0x30) * 0x1000003d1 + s->n[0];
  if (((uVar5 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar5 & 0xfffffffffffff) != 0)) {
LAB_00145469:
    secp256k1_fe_sqr(&local_50,s);
    secp256k1_fe_mul(&r->x,&r->x,&local_50);
    r_00 = &r->y;
    secp256k1_fe_mul(r_00,r_00,&local_50);
    secp256k1_fe_mul(r_00,r_00,s);
    secp256k1_fe_mul(&r->z,&r->z,s);
    secp256k1_gej_verify(r);
    return;
  }
  uVar10 = (uVar5 >> 0x34) + s->n[1];
  psVar14 = (secp256k1_gej *)((uVar10 >> 0x34) + s->n[2]);
  psVar17 = (secp256k1_gej *)(((ulong)psVar14 >> 0x34) + s->n[3]);
  uVar18 = ((ulong)psVar17 >> 0x34) + (s->n[4] & 0xffffffffffff);
  if ((((uVar10 | uVar5 | (ulong)psVar14 | (ulong)psVar17) & 0xfffffffffffff) != 0 || uVar18 != 0)
     && (((uVar5 | 0x1000003d0) & uVar10 & (ulong)psVar14 & (ulong)psVar17 &
         (uVar18 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_00145469;
  secp256k1_gej_rescale_cold_1();
  uStack_78 = 0x1000003d0;
  a_00 = (secp256k1_gej *)auStack_110;
  a_01 = (secp256k1_gej *)auStack_110;
  puVar28 = auStack_110;
  auStack_110._144_8_ = r;
  secp256k1_gej_verify(psVar14);
  psVar17->infinity = psVar14->infinity;
  secp256k1_fe_mul(&psVar17->z,&psVar14->z,&psVar14->y);
  secp256k1_fe_sqr((secp256k1_fe *)auStack_110,&psVar14->y);
  psVar16 = (secp256k1_gej *)(auStack_110 + 0x60);
  psVar15 = psVar14;
  secp256k1_fe_sqr((secp256k1_fe *)psVar16,&psVar14->x);
  secp256k1_fe_verify((secp256k1_fe *)psVar16);
  if ((int)auStack_110._136_4_ < 0xb) {
    auStack_110._136_4_ = auStack_110._136_4_ * 3;
    psVar15 = (secp256k1_gej *)(auStack_110 + 0x60);
    auStack_110._96_8_ = auStack_110._96_8_ * 3;
    auStack_110._104_8_ = auStack_110._104_8_ * 3;
    auStack_110._112_8_ = auStack_110._112_8_ * 3;
    auStack_110._120_8_ = auStack_110._120_8_ * 3;
    auStack_110._128_8_ = auStack_110._128_8_ * 3;
    auStack_110._140_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)psVar15);
    secp256k1_fe_half((secp256k1_fe *)psVar15);
    secp256k1_fe_verify((secp256k1_fe *)auStack_110);
    secp256k1_fe_verify_magnitude((secp256k1_fe *)auStack_110,1);
    auStack_110._48_8_ = 0x3ffffbfffff0bc - auStack_110._0_8_;
    auStack_110._56_8_ = 0x3ffffffffffffc - auStack_110._8_8_;
    psVar25 = (secp256k1_gej *)(auStack_110 + 0x30);
    auStack_110._64_8_ = 0x3ffffffffffffc - auStack_110._16_8_;
    auStack_110._72_8_ = 0x3ffffffffffffc - auStack_110._24_8_;
    auStack_110._80_8_ = 0x3fffffffffffc - auStack_110._32_8_;
    auStack_110._88_8_ = 2;
    secp256k1_fe_verify((secp256k1_fe *)psVar25);
    secp256k1_fe_mul((secp256k1_fe *)psVar25,(secp256k1_fe *)psVar25,&psVar14->x);
    secp256k1_fe_sqr(&psVar17->x,(secp256k1_fe *)psVar15);
    secp256k1_fe_verify(&psVar17->x);
    psVar16 = psVar25;
    secp256k1_fe_verify((secp256k1_fe *)psVar25);
    iVar3 = auStack_110._88_4_ + (psVar17->x).magnitude;
    unaff_R13 = auStack_110;
    if (0x20 < iVar3) goto LAB_00145835;
    uVar27 = (psVar17->x).n[1];
    uVar1 = (psVar17->x).n[2];
    uVar2 = (psVar17->x).n[3];
    psVar14 = (secp256k1_gej *)(auStack_110 + 0x30);
    (psVar17->x).n[0] = (psVar17->x).n[0] + auStack_110._48_8_;
    (psVar17->x).n[1] = uVar27 + auStack_110._56_8_;
    (psVar17->x).n[2] = uVar1 + auStack_110._64_8_;
    (psVar17->x).n[3] = uVar2 + auStack_110._72_8_;
    puVar21 = (psVar17->x).n + 4;
    *puVar21 = *puVar21 + auStack_110._80_8_;
    (psVar17->x).magnitude = iVar3;
    (psVar17->x).normalized = 0;
    secp256k1_fe_verify(&psVar17->x);
    secp256k1_fe_verify(&psVar17->x);
    psVar16 = psVar14;
    secp256k1_fe_verify((secp256k1_fe *)psVar14);
    iVar3 = auStack_110._88_4_ + (psVar17->x).magnitude;
    unaff_R13 = auStack_110;
    if (0x20 < iVar3) goto LAB_0014583a;
    uVar27 = (psVar17->x).n[1];
    uVar1 = (psVar17->x).n[2];
    uVar2 = (psVar17->x).n[3];
    psVar14 = (secp256k1_gej *)(auStack_110 + 0x30);
    (psVar17->x).n[0] = (psVar17->x).n[0] + auStack_110._48_8_;
    (psVar17->x).n[1] = uVar27 + auStack_110._56_8_;
    (psVar17->x).n[2] = uVar1 + auStack_110._64_8_;
    (psVar17->x).n[3] = uVar2 + auStack_110._72_8_;
    puVar21 = (psVar17->x).n + 4;
    *puVar21 = *puVar21 + auStack_110._80_8_;
    (psVar17->x).magnitude = iVar3;
    (psVar17->x).normalized = 0;
    secp256k1_fe_verify(&psVar17->x);
    secp256k1_fe_sqr((secp256k1_fe *)auStack_110,(secp256k1_fe *)auStack_110);
    secp256k1_fe_verify((secp256k1_fe *)psVar14);
    psVar16 = psVar17;
    secp256k1_fe_verify(&psVar17->x);
    uVar4 = (psVar17->x).magnitude + auStack_110._88_4_;
    unaff_R13 = auStack_110;
    if (0x20 < (int)uVar4) goto LAB_0014583f;
    a_00 = (secp256k1_gej *)(auStack_110 + 0x30);
    auStack_110._48_8_ = (psVar17->x).n[0] + auStack_110._48_8_;
    auStack_110._56_8_ = (psVar17->x).n[1] + auStack_110._56_8_;
    auStack_110._64_8_ = (psVar17->x).n[2] + auStack_110._64_8_;
    auStack_110._72_8_ = (psVar17->x).n[3] + auStack_110._72_8_;
    auStack_110._80_8_ = auStack_110._80_8_ + (psVar17->x).n[4];
    auStack_110._92_4_ = 0;
    auStack_110._88_4_ = uVar4;
    secp256k1_fe_verify((secp256k1_fe *)a_00);
    psVar14 = (secp256k1_gej *)&psVar17->y;
    secp256k1_fe_mul((secp256k1_fe *)psVar14,(secp256k1_fe *)a_00,
                     (secp256k1_fe *)(auStack_110 + 0x60));
    secp256k1_fe_verify((secp256k1_fe *)psVar14);
    secp256k1_fe_verify((secp256k1_fe *)auStack_110);
    iVar3 = auStack_110._40_4_ + (psVar17->y).magnitude;
    unaff_R13 = auStack_110;
    if (iVar3 < 0x21) {
      uVar27 = (psVar17->y).n[1];
      uVar1 = (psVar17->y).n[2];
      uVar2 = (psVar17->y).n[3];
      (psVar17->y).n[0] = (psVar17->y).n[0] + auStack_110._0_8_;
      (psVar17->y).n[1] = uVar27 + auStack_110._8_8_;
      (psVar17->y).n[2] = uVar1 + auStack_110._16_8_;
      (psVar17->y).n[3] = uVar2 + auStack_110._24_8_;
      puVar21 = (psVar17->y).n + 4;
      *puVar21 = *puVar21 + auStack_110._32_8_;
      (psVar17->y).magnitude = iVar3;
      (psVar17->y).normalized = 0;
      secp256k1_fe_verify((secp256k1_fe *)psVar14);
      secp256k1_fe_verify((secp256k1_fe *)psVar14);
      secp256k1_fe_verify_magnitude((secp256k1_fe *)psVar14,2);
      uVar27 = (psVar17->y).n[1];
      uVar1 = (psVar17->y).n[2];
      uVar2 = (psVar17->y).n[3];
      (psVar17->y).n[0] = 0x5ffff9ffffe91a - (psVar17->y).n[0];
      (psVar17->y).n[1] = 0x5ffffffffffffa - uVar27;
      (psVar17->y).n[2] = 0x5ffffffffffffa - uVar1;
      (psVar17->y).n[3] = 0x5ffffffffffffa - uVar2;
      (psVar17->y).n[4] = 0x5fffffffffffa - (psVar17->y).n[4];
      (psVar17->y).magnitude = 3;
      (psVar17->y).normalized = 0;
      secp256k1_fe_verify((secp256k1_fe *)psVar14);
      secp256k1_gej_verify(psVar17);
      return;
    }
  }
  else {
    secp256k1_gej_double_cold_5();
LAB_00145835:
    secp256k1_gej_double_cold_4();
LAB_0014583a:
    a_00 = psVar15;
    secp256k1_gej_double_cold_3();
LAB_0014583f:
    a_01 = psVar16;
    puVar28 = auStack_110 + 0x60;
    secp256k1_gej_double_cold_2();
  }
  secp256k1_gej_double_cold_1();
  uVar5 = (ulong)a_00 & 0xffffffff;
  psStack_130 = (secp256k1_gej *)0x145856;
  psVar16 = a_01;
  psStack_120 = psVar17;
  secp256k1_fe_verify(&a_01->x);
  if ((uint)a_00 < 0x21) {
    iVar3 = (a_01->x).magnitude * (uint)a_00;
    if (iVar3 < 0x21) {
      (a_01->x).n[0] = (a_01->x).n[0] * uVar5;
      (a_01->x).n[1] = (a_01->x).n[1] * uVar5;
      (a_01->x).n[2] = (a_01->x).n[2] * uVar5;
      (a_01->x).n[3] = (a_01->x).n[3] * uVar5;
      (a_01->x).n[4] = uVar5 * (a_01->x).n[4];
      (a_01->x).magnitude = iVar3;
      (a_01->x).normalized = 0;
      secp256k1_fe_verify(&a_01->x);
      return;
    }
  }
  else {
    psStack_130 = (secp256k1_gej *)0x1458bc;
    secp256k1_fe_mul_int_unchecked_cold_2();
  }
  psStack_130 = (secp256k1_gej *)secp256k1_fe_half;
  secp256k1_fe_mul_int_unchecked_cold_1();
  pcStack_138 = (code *)0x1458ca;
  psStack_130 = a_01;
  secp256k1_fe_verify(&psVar16->x);
  pcStack_138 = (code *)0x1458d7;
  psVar17 = psVar16;
  secp256k1_fe_verify_magnitude(&psVar16->x,0x1f);
  modinfo = (secp256k1_modinv64_modinfo *)(psVar16->x).n[0];
  uVar10 = -(ulong)((uint)modinfo & 1);
  uVar18 = uVar10 >> 0xc;
  uVar7 = (long)(modinfo->modulus).v + (uVar18 & 0xffffefffffc2f);
  if ((uVar7 & 1) == 0) {
    uVar5 = (uVar10 >> 0x10) + (psVar16->x).n[4];
    uVar8 = uVar18 + (psVar16->x).n[3];
    uVar4 = (uint)(uVar10 >> 0x2c);
    auVar30._0_8_ = CONCAT44(uVar4,(int)uVar18);
    auVar30._8_4_ = (int)uVar18;
    auVar30._12_4_ = uVar4;
    uVar10 = auVar30._0_8_ + (psVar16->x).n[1];
    uVar18 = auVar30._8_8_ + (psVar16->x).n[2];
    (psVar16->x).n[0] = ((ulong)((uint)uVar10 & 1) << 0x33) + (uVar7 >> 1);
    (psVar16->x).n[1] = ((uVar18 & 1) << 0x33) + (uVar10 >> 1);
    (psVar16->x).n[2] = ((uVar8 & 1) << 0x33) + (uVar18 >> 1);
    (psVar16->x).n[3] = ((ulong)((uint)uVar5 & 1) << 0x33) + (uVar8 >> 1);
    (psVar16->x).n[4] = uVar5 >> 1;
    (psVar16->x).magnitude = ((psVar16->x).magnitude >> 1) + 1;
    (psVar16->x).normalized = 0;
    secp256k1_fe_verify(&psVar16->x);
    return;
  }
  pcStack_138 = secp256k1_modinv64;
  secp256k1_fe_half_cold_1();
  uVar7 = 0;
  auStack_1b8._16_8_ = 0;
  auStack_1b8._24_8_ = 0;
  auStack_1b8._0_8_ = 0;
  auStack_1b8._8_8_ = 0;
  auStack_1b8._32_8_ = 0;
  auStack_1b8._56_8_ = 0;
  auStack_1b8._80_8_ = 0;
  auStack_1b8._64_8_ = 0;
  auStack_1b8._72_8_ = 0;
  auStack_1b8._48_8_ = 1;
  auStack_278._32_8_ = (modinfo->modulus).v[4];
  auStack_278._0_8_ = (modinfo->modulus).v[0];
  uStack_288 = (modinfo->modulus).v[1];
  uStack_290 = (modinfo->modulus).v[2];
  auStack_278._24_8_ = (modinfo->modulus).v[3];
  auStack_208._0_8_ = (psVar17->x).n[0];
  uStack_298 = (psVar17->x).n[1];
  uStack_2a0 = (psVar17->x).n[2];
  uStack_280 = (psVar17->x).n[3];
  uVar27 = (psVar17->x).n[4];
  uVar8 = 0xffffffffffffffff;
  uVar10 = auStack_278._0_8_;
  uVar18 = auStack_208._0_8_;
  psVar15 = (secp256k1_gej *)auStack_278._32_8_;
  psStack_2b8 = (secp256k1_gej *)auStack_278._24_8_;
  auStack_278._8_8_ = uStack_288;
  auStack_278._16_8_ = uStack_290;
  auStack_278._48_8_ = psVar17;
  auStack_208._8_8_ = uStack_298;
  auStack_208._16_8_ = uStack_2a0;
  auStack_208._24_8_ = uStack_280;
  auStack_208._32_8_ = uVar27;
  auStack_1b8._88_8_ = psVar16;
  psStack_158 = psVar25;
  puStack_150 = unaff_R13;
  psStack_148 = psVar14;
  puStack_140 = puVar28;
  pcStack_138 = (code *)uVar5;
  do {
    uVar26 = 8;
    lVar9 = 3;
    uVar5 = 0;
    uVar23 = 0;
    psVar25 = (secp256k1_gej *)0x8;
    psStack_2c0 = (secp256k1_gej *)0x8;
    uVar6 = uVar18;
    uVar11 = uVar10;
    do {
      auStack_278._72_8_ = uVar7;
      auStack_278._80_8_ = uVar27;
      auStack_278._88_8_ = psVar15;
      if ((uVar11 & 1) == 0) {
        secp256k1_modinv64_cold_29();
LAB_00146478:
        secp256k1_modinv64_cold_1();
LAB_0014647d:
        secp256k1_modinv64_cold_2();
LAB_00146482:
        secp256k1_modinv64_cold_28();
        goto LAB_00146487;
      }
      psVar17 = (secp256k1_gej *)(uVar5 * uVar18 + uVar26 * uVar10);
      psVar25 = (secp256k1_gej *)(uVar11 << ((byte)lVar9 & 0x3f));
      if (psVar17 != psVar25) goto LAB_00146478;
      psVar17 = (secp256k1_gej *)((long)psStack_2c0 * uVar18 + uVar23 * uVar10);
      psVar25 = (secp256k1_gej *)(uVar6 << ((byte)lVar9 & 0x3f));
      if (psVar17 != psVar25) goto LAB_0014647d;
      psVar25 = (secp256k1_gej *)((long)uVar8 >> 0x3f);
      uStack_218 = (ulong)((uint)uVar6 & 1);
      uVar20 = -uStack_218;
      psVar17 = (secp256k1_gej *)((ulong)psVar25 & uVar20);
      psStack_210 = psVar25;
      if ((uVar8 ^ (ulong)psVar17) - 0x251 < 0xfffffffffffffb61) goto LAB_00146482;
      uVar8 = (uVar8 ^ (ulong)psVar17) - 1;
      psStack_2c0 = (secp256k1_gej *)
                    ((long)(psStack_2c0->x).n + (((ulong)psVar25 ^ uVar5) - (long)psVar25 & uVar20))
      ;
      uVar5 = (uVar5 + ((ulong)psStack_2c0 & (ulong)psVar17)) * 2;
      uVar23 = uVar23 + (((ulong)psVar25 ^ uVar26) - (long)psVar25 & uVar20);
      uVar26 = (uVar26 + (uVar23 & (ulong)psVar17)) * 2;
      uVar20 = (((ulong)psVar25 ^ uVar11) - (long)psVar25 & uVar20) + uVar6;
      uVar6 = uVar20 >> 1;
      uVar11 = uVar11 + (uVar20 & (ulong)psVar17);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x3e);
    psVar25 = (secp256k1_gej *)(uVar5 * uVar23);
    psVar17 = psStack_2c0;
    auStack_208._48_8_ = uVar26;
    uStack_1d0 = uVar5;
    uStack_1c8 = uVar23;
    psStack_1c0 = psStack_2c0;
    if ((SUB168(SEXT816((long)uVar26) * SEXT816((long)psStack_2c0),8) -
        SUB168(SEXT816((long)uVar5) * SEXT816((long)uVar23),8)) -
        (ulong)((secp256k1_gej *)(uVar26 * (long)psStack_2c0) < psVar25) != 2 ||
        (long)(uVar26 * (long)psStack_2c0) - (long)psVar25 != 0) {
LAB_00146487:
      secp256k1_modinv64_cold_3();
LAB_0014648c:
      secp256k1_modinv64_cold_27();
LAB_00146491:
      secp256k1_modinv64_cold_26();
LAB_00146496:
      psVar14 = psVar17;
      secp256k1_modinv64_cold_25();
LAB_0014649b:
      secp256k1_modinv64_cold_24();
LAB_001464a0:
      secp256k1_modinv64_cold_4();
LAB_001464a5:
      secp256k1_modinv64_cold_5();
LAB_001464aa:
      secp256k1_modinv64_cold_6();
LAB_001464af:
      secp256k1_modinv64_cold_7();
LAB_001464b4:
      secp256k1_modinv64_cold_8();
LAB_001464b9:
      secp256k1_modinv64_cold_9();
LAB_001464be:
      secp256k1_modinv64_cold_10();
LAB_001464c3:
      secp256k1_modinv64_cold_11();
LAB_001464c8:
      secp256k1_modinv64_cold_12();
LAB_001464cd:
      secp256k1_modinv64_cold_13();
LAB_001464d2:
      secp256k1_modinv64_cold_14();
LAB_001464d7:
      secp256k1_modinv64_cold_15();
LAB_001464dc:
      secp256k1_modinv64_cold_23();
      psVar16 = psVar25;
LAB_001464e1:
      secp256k1_modinv64_cold_22();
      psVar17 = psVar14;
LAB_001464e6:
      psVar15 = psVar17;
      secp256k1_modinv64_cold_21();
LAB_001464eb:
      secp256k1_modinv64_cold_20();
LAB_001464f0:
      psVar17 = psVar15;
      secp256k1_modinv64_cold_19();
LAB_001464f5:
      secp256k1_modinv64_cold_18();
      goto LAB_001464fa;
    }
    secp256k1_modinv64_update_de_62
              ((secp256k1_modinv64_signed62 *)auStack_1b8,
               (secp256k1_modinv64_signed62 *)(auStack_1b8 + 0x30),
               (secp256k1_modinv64_trans2x2 *)(auStack_208 + 0x30),modinfo);
    psVar17 = (secp256k1_gej *)auStack_278;
    psVar25 = (secp256k1_gej *)0x5;
    iVar3 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar17,5,&modinfo->modulus,-1);
    if (iVar3 < 1) goto LAB_0014648c;
    psVar17 = (secp256k1_gej *)auStack_278;
    psVar25 = (secp256k1_gej *)0x5;
    iVar3 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar17,5,&modinfo->modulus,1);
    if (0 < iVar3) goto LAB_00146491;
    psVar14 = (secp256k1_gej *)auStack_208;
    psVar25 = (secp256k1_gej *)0x5;
    psVar17 = psVar14;
    iVar3 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar14,5,&modinfo->modulus,-1);
    if (iVar3 < 1) goto LAB_00146496;
    psVar25 = (secp256k1_gej *)0x5;
    iVar3 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar14,5,&modinfo->modulus,1);
    if (-1 < iVar3) goto LAB_0014649b;
    psVar14 = (secp256k1_gej *)(uVar26 * uVar10);
    psVar25 = SUB168(SEXT816((long)uVar26) * SEXT816((long)uVar10),8);
    uVar7 = uVar5 * uVar18;
    lVar9 = SUB168(SEXT816((long)uVar5) * SEXT816((long)uVar18),8);
    if ((-1 < lVar9) &&
       (uVar6 = (ulong)((secp256k1_gej *)(-1 - uVar7) < psVar14),
       lVar12 = (0x7fffffffffffffff - lVar9) - (long)psVar25,
       (SBORROW8(0x7fffffffffffffff - lVar9,(long)psVar25) != SBORROW8(lVar12,uVar6)) !=
       (long)(lVar12 - uVar6) < 0)) goto LAB_001464a0;
    puVar21 = (uint64_t *)((long)(psVar14->x).n + uVar7);
    lVar9 = (long)(psVar25->x).n + (ulong)CARRY8(uVar7,(ulong)psVar14) + lVar9;
    psVar14 = (secp256k1_gej *)(uVar23 * uVar10);
    psVar25 = SUB168(SEXT816((long)uVar23) * SEXT816((long)uVar10),8);
    uVar10 = (long)psStack_2c0 * uVar18;
    lVar12 = SUB168(SEXT816((long)psStack_2c0) * SEXT816((long)uVar18),8);
    if ((-1 < lVar12) &&
       (uVar18 = (ulong)((secp256k1_gej *)(-1 - uVar10) < psVar14),
       lVar13 = (0x7fffffffffffffff - lVar12) - (long)psVar25,
       (SBORROW8(0x7fffffffffffffff - lVar12,(long)psVar25) != SBORROW8(lVar13,uVar18)) !=
       (long)(lVar13 - uVar18) < 0)) goto LAB_001464a5;
    bVar29 = CARRY8((ulong)psVar14,uVar10);
    psVar14 = (secp256k1_gej *)((long)(psVar14->x).n + uVar10);
    psVar25 = (secp256k1_gej *)((long)(psVar25->x).n + (ulong)bVar29 + lVar12);
    if (((ulong)puVar21 & 0x3ffffffffffffffe) != 0) goto LAB_001464aa;
    if (((ulong)psVar14 & 0x3fffffffffffffff) != 0) goto LAB_001464af;
    uVar10 = (ulong)puVar21 >> 0x3e | lVar9 * 4;
    uVar7 = uStack_288 * uVar26 + uVar10;
    lVar19 = SUB168(SEXT816((long)uStack_288) * SEXT816((long)uVar26),8) + (lVar9 >> 0x3e) +
             (ulong)CARRY8(uStack_288 * uVar26,uVar10);
    uVar18 = uStack_298 * uVar5;
    lVar13 = SUB168(SEXT816((long)uStack_298) * SEXT816((long)uVar5),8);
    uVar10 = (ulong)(-uVar18 - 1 < uVar7);
    lVar9 = (0x7fffffffffffffff - lVar13) - lVar19;
    lVar22 = (-0x8000000000000000 - lVar13) - (ulong)(uVar18 != 0);
    lVar12 = lVar19 - lVar22;
    bVar29 = (SBORROW8(0x7fffffffffffffff - lVar13,lVar19) != SBORROW8(lVar9,uVar10)) ==
             (long)(lVar9 - uVar10) < 0;
    if (lVar13 < 0) {
      bVar29 = (SBORROW8(lVar19,lVar22) != SBORROW8(lVar12,(ulong)(uVar7 < -uVar18))) ==
               (long)(lVar12 - (ulong)(uVar7 < -uVar18)) < 0;
    }
    if (!bVar29) goto LAB_001464b4;
    uVar10 = (ulong)psVar14 >> 0x3e | (long)psVar25 * 4;
    uVar11 = uStack_288 * uVar23 + uVar10;
    lVar12 = SUB168(SEXT816((long)uStack_288) * SEXT816((long)uVar23),8) + ((long)psVar25 >> 0x3e) +
             (ulong)CARRY8(uStack_288 * uVar23,uVar10);
    uVar6 = uStack_298 * (long)psStack_2c0;
    psVar14 = SUB168(SEXT816((long)uStack_298) * SEXT816((long)psStack_2c0),8);
    uVar10 = (ulong)(-uVar6 - 1 < uVar11);
    lVar9 = (0x7fffffffffffffff - (long)psVar14) - lVar12;
    psVar25 = (secp256k1_gej *)((-0x8000000000000000 - (long)psVar14) - (ulong)(uVar6 != 0));
    bVar29 = (SBORROW8(0x7fffffffffffffff - (long)psVar14,lVar12) != SBORROW8(lVar9,uVar10)) ==
             (long)(lVar9 - uVar10) < 0;
    if ((long)psVar14 < 0) {
      bVar29 = (SBORROW8(lVar12,(long)psVar25) !=
               SBORROW8(lVar12 - (long)psVar25,(ulong)(uVar11 < -uVar6))) ==
               (long)((lVar12 - (long)psVar25) - (ulong)(uVar11 < -uVar6)) < 0;
    }
    if (!bVar29) goto LAB_001464b9;
    lVar9 = lVar13 + lVar19 + (ulong)CARRY8(uVar18,uVar7);
    psVar14 = (secp256k1_gej *)((long)(psVar14->x).n + (ulong)CARRY8(uVar6,uVar11) + lVar12);
    uVar10 = lVar9 * 4 | uVar18 + uVar7 >> 0x3e;
    auStack_278._0_8_ = uVar18 + uVar7 & 0x3fffffffffffffff;
    auStack_278._64_8_ = uVar6 + uVar11 & 0x3fffffffffffffff;
    uVar7 = uStack_290 * uVar26 + uVar10;
    lVar12 = (lVar9 >> 0x3e) + SUB168(SEXT816((long)uStack_290) * SEXT816((long)uVar26),8) +
             (ulong)CARRY8(uStack_290 * uVar26,uVar10);
    uVar18 = uStack_2a0 * uVar5;
    lVar13 = SUB168(SEXT816((long)uStack_2a0) * SEXT816((long)uVar5),8);
    uVar10 = (ulong)(-uVar18 - 1 < uVar7);
    lVar9 = (0x7fffffffffffffff - lVar13) - lVar12;
    psVar25 = (secp256k1_gej *)((-0x8000000000000000 - lVar13) - (ulong)(uVar18 != 0));
    bVar29 = (SBORROW8(0x7fffffffffffffff - lVar13,lVar12) != SBORROW8(lVar9,uVar10)) ==
             (long)(lVar9 - uVar10) < 0;
    if (lVar13 < 0) {
      bVar29 = (SBORROW8(lVar12,(long)psVar25) !=
               SBORROW8(lVar12 - (long)psVar25,(ulong)(uVar7 < -uVar18))) ==
               (long)((lVar12 - (long)psVar25) - (ulong)(uVar7 < -uVar18)) < 0;
    }
    auStack_208._0_8_ = auStack_278._64_8_;
    if (!bVar29) goto LAB_001464be;
    uVar10 = uVar6 + uVar11 >> 0x3e | (long)psVar14 * 4;
    uVar11 = uStack_290 * uVar23 + uVar10;
    psVar25 = (secp256k1_gej *)
              (SUB168(SEXT816((long)uStack_290) * SEXT816((long)uVar23),8) + ((long)psVar14 >> 0x3e)
              + (ulong)CARRY8(uStack_290 * uVar23,uVar10));
    uVar6 = uStack_2a0 * (long)psStack_2c0;
    lVar22 = SUB168(SEXT816((long)uStack_2a0) * SEXT816((long)psStack_2c0),8);
    uVar10 = (ulong)(-uVar6 - 1 < uVar11);
    lVar9 = (0x7fffffffffffffff - lVar22) - (long)psVar25;
    lVar24 = (-0x8000000000000000 - lVar22) - (ulong)(uVar6 != 0);
    lVar19 = (long)psVar25 - lVar24;
    bVar29 = (SBORROW8(0x7fffffffffffffff - lVar22,(long)psVar25) != SBORROW8(lVar9,uVar10)) ==
             (long)(lVar9 - uVar10) < 0;
    if (lVar22 < 0) {
      bVar29 = (SBORROW8((long)psVar25,lVar24) != SBORROW8(lVar19,(ulong)(uVar11 < -uVar6))) ==
               (long)(lVar19 - (ulong)(uVar11 < -uVar6)) < 0;
    }
    psVar14 = (secp256k1_gej *)(ulong)bVar29;
    auStack_278._56_8_ = auStack_278._0_8_;
    if (bVar29 == false) goto LAB_001464c3;
    lVar9 = lVar12 + lVar13 + (ulong)CARRY8(uVar7,uVar18);
    psVar25 = (secp256k1_gej *)((long)(psVar25->x).n + (ulong)CARRY8(uVar11,uVar6) + lVar22);
    uVar10 = lVar9 * 4 | uVar7 + uVar18 >> 0x3e;
    uStack_288 = uVar7 + uVar18 & 0x3fffffffffffffff;
    uStack_298 = uVar11 + uVar6 & 0x3fffffffffffffff;
    uVar7 = (long)psStack_2b8 * uVar26 + uVar10;
    lVar12 = (lVar9 >> 0x3e) + SUB168(SEXT816((long)psStack_2b8) * SEXT816((long)uVar26),8) +
             (ulong)CARRY8((long)psStack_2b8 * uVar26,uVar10);
    uVar18 = uStack_280 * uVar5;
    lVar13 = SUB168(SEXT816((long)uStack_280) * SEXT816((long)uVar5),8);
    uVar10 = (ulong)(-uVar18 - 1 < uVar7);
    lVar9 = (0x7fffffffffffffff - lVar13) - lVar12;
    psVar14 = (secp256k1_gej *)((-0x8000000000000000 - lVar13) - (ulong)(uVar18 != 0));
    bVar29 = (SBORROW8(0x7fffffffffffffff - lVar13,lVar12) != SBORROW8(lVar9,uVar10)) ==
             (long)(lVar9 - uVar10) < 0;
    if (lVar13 < 0) {
      bVar29 = (SBORROW8(lVar12,(long)psVar14) !=
               SBORROW8(lVar12 - (long)psVar14,(ulong)(uVar7 < -uVar18))) ==
               (long)((lVar12 - (long)psVar14) - (ulong)(uVar7 < -uVar18)) < 0;
    }
    auStack_278._8_8_ = uStack_288;
    auStack_208._8_8_ = uStack_298;
    if (!bVar29) goto LAB_001464c8;
    uVar10 = uVar11 + uVar6 >> 0x3e | (long)psVar25 * 4;
    uVar11 = (long)psStack_2b8 * uVar23 + uVar10;
    psVar14 = (secp256k1_gej *)
              (SUB168(SEXT816((long)psStack_2b8) * SEXT816((long)uVar23),8) +
               ((long)psVar25 >> 0x3e) + (ulong)CARRY8((long)psStack_2b8 * uVar23,uVar10));
    uVar6 = uStack_280 * (long)psStack_2c0;
    lVar22 = SUB168(SEXT816((long)uStack_280) * SEXT816((long)psStack_2c0),8);
    uVar10 = (ulong)(-uVar6 - 1 < uVar11);
    lVar9 = (0x7fffffffffffffff - lVar22) - (long)psVar14;
    lVar24 = (-0x8000000000000000 - lVar22) - (ulong)(uVar6 != 0);
    lVar19 = (long)psVar14 - lVar24;
    bVar29 = (SBORROW8(0x7fffffffffffffff - lVar22,(long)psVar14) != SBORROW8(lVar9,uVar10)) ==
             (long)(lVar9 - uVar10) < 0;
    if (lVar22 < 0) {
      bVar29 = (SBORROW8((long)psVar14,lVar24) != SBORROW8(lVar19,(ulong)(uVar11 < -uVar6))) ==
               (long)(lVar19 - (ulong)(uVar11 < -uVar6)) < 0;
    }
    psVar25 = (secp256k1_gej *)(ulong)bVar29;
    if (bVar29 == false) goto LAB_001464cd;
    lVar9 = lVar12 + lVar13 + (ulong)CARRY8(uVar7,uVar18);
    psVar14 = (secp256k1_gej *)((long)(psVar14->x).n + (ulong)CARRY8(uVar11,uVar6) + lVar22);
    uVar10 = lVar9 * 4 | uVar7 + uVar18 >> 0x3e;
    uStack_290 = uVar7 + uVar18 & 0x3fffffffffffffff;
    uStack_2a0 = uVar11 + uVar6 & 0x3fffffffffffffff;
    uVar18 = auStack_278._88_8_ * uVar26 + uVar10;
    lVar13 = (lVar9 >> 0x3e) + SUB168(SEXT816((long)auStack_278._88_8_) * SEXT816((long)uVar26),8) +
             (ulong)CARRY8(auStack_278._88_8_ * uVar26,uVar10);
    uVar10 = auStack_278._80_8_ * uVar5;
    psVar25 = SUB168(SEXT816((long)auStack_278._80_8_) * SEXT816((long)uVar5),8);
    uVar5 = (ulong)(-uVar10 - 1 < uVar18);
    lVar9 = (0x7fffffffffffffff - (long)psVar25) - lVar13;
    lVar19 = (-0x8000000000000000 - (long)psVar25) - (ulong)(uVar10 != 0);
    lVar12 = lVar13 - lVar19;
    bVar29 = (SBORROW8(0x7fffffffffffffff - (long)psVar25,lVar13) != SBORROW8(lVar9,uVar5)) ==
             (long)(lVar9 - uVar5) < 0;
    if ((long)psVar25 < 0) {
      bVar29 = (SBORROW8(lVar13,lVar19) != SBORROW8(lVar12,(ulong)(uVar18 < -uVar10))) ==
               (long)(lVar12 - (ulong)(uVar18 < -uVar10)) < 0;
    }
    auStack_278._16_8_ = uStack_290;
    auStack_208._16_8_ = uStack_2a0;
    if (!bVar29) goto LAB_001464d2;
    uVar5 = uVar11 + uVar6 >> 0x3e | (long)psVar14 * 4;
    uVar26 = auStack_278._88_8_ * uVar23 + uVar5;
    lVar22 = SUB168(SEXT816((long)auStack_278._88_8_) * SEXT816((long)uVar23),8) +
             ((long)psVar14 >> 0x3e) + (ulong)CARRY8(auStack_278._88_8_ * uVar23,uVar5);
    uVar7 = auStack_278._80_8_ * (long)psStack_2c0;
    lVar19 = SUB168(SEXT816((long)auStack_278._80_8_) * SEXT816((long)psStack_2c0),8);
    uVar5 = (ulong)(-uVar7 - 1 < uVar26);
    lVar9 = (0x7fffffffffffffff - lVar19) - lVar22;
    lVar24 = (-0x8000000000000000 - lVar19) - (ulong)(uVar7 != 0);
    lVar12 = lVar22 - lVar24;
    bVar29 = (SBORROW8(0x7fffffffffffffff - lVar19,lVar22) != SBORROW8(lVar9,uVar5)) ==
             (long)(lVar9 - uVar5) < 0;
    if (lVar19 < 0) {
      bVar29 = (SBORROW8(lVar22,lVar24) != SBORROW8(lVar12,(ulong)(uVar26 < -uVar7))) ==
               (long)(lVar12 - (ulong)(uVar26 < -uVar7)) < 0;
    }
    psVar14 = (secp256k1_gej *)(ulong)bVar29;
    if (bVar29 == false) goto LAB_001464d7;
    lVar9 = (long)(psVar25->x).n + (ulong)CARRY8(uVar18,uVar10) + lVar13;
    lVar12 = lVar22 + lVar19 + (ulong)CARRY8(uVar26,uVar7);
    psVar25 = (secp256k1_gej *)(lVar9 * 4 | uVar18 + uVar10 >> 0x3e);
    psVar14 = (secp256k1_gej *)(uVar18 + uVar10 & 0x3fffffffffffffff);
    uStack_280 = uVar26 + uVar7 & 0x3fffffffffffffff;
    auStack_278._24_8_ = psVar14;
    auStack_208._24_8_ = uStack_280;
    if ((lVar9 >> 0x3e) + -1 + (ulong)((secp256k1_gej *)0x7fffffffffffffff < psVar25) != -1)
    goto LAB_001464dc;
    uVar27 = uVar26 + uVar7 >> 0x3e | lVar12 * 4;
    psVar16 = psVar25;
    auStack_278._32_8_ = psVar25;
    if ((lVar12 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar27) != -1) goto LAB_001464e1;
    psVar15 = (secp256k1_gej *)auStack_278;
    psVar16 = (secp256k1_gej *)0x5;
    psVar17 = psVar15;
    auStack_208._32_8_ = uVar27;
    iVar3 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar15,5,&modinfo->modulus,-1);
    if (iVar3 < 1) goto LAB_001464e6;
    psVar16 = (secp256k1_gej *)0x5;
    iVar3 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar15,5,&modinfo->modulus,1);
    if (0 < iVar3) goto LAB_001464eb;
    psVar17 = (secp256k1_gej *)auStack_208;
    psVar16 = (secp256k1_gej *)0x5;
    psVar15 = psVar17;
    iVar3 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar17,5,&modinfo->modulus,-1);
    if (iVar3 < 1) goto LAB_001464f0;
    psVar16 = (secp256k1_gej *)0x5;
    iVar3 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar17,5,&modinfo->modulus,1);
    if (-1 < iVar3) goto LAB_001464f5;
    uVar4 = (int)auStack_278._72_8_ + 1;
    uVar7 = (ulong)uVar4;
    uVar10 = auStack_278._56_8_;
    uVar18 = auStack_278._64_8_;
    psVar15 = psVar25;
    psStack_2b8 = psVar14;
  } while (uVar4 != 10);
  psVar17 = (secp256k1_gej *)auStack_208;
  psVar16 = (secp256k1_gej *)0x5;
  iVar3 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)psVar17,5,&SECP256K1_SIGNED62_ONE,0);
  if (iVar3 == 0) {
    iVar3 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)auStack_278,5,&SECP256K1_SIGNED62_ONE,-1);
    a = auStack_278._48_8_;
    if (iVar3 != 0) {
      iVar3 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)auStack_278,5,&SECP256K1_SIGNED62_ONE,1);
      if (iVar3 != 0) {
        psVar16 = (secp256k1_gej *)0x5;
        psVar17 = (secp256k1_gej *)a;
        iVar3 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)a,5,&SECP256K1_SIGNED62_ONE,0);
        if (iVar3 == 0) {
          psVar17 = (secp256k1_gej *)auStack_1b8;
          psVar16 = (secp256k1_gej *)0x5;
          iVar3 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar17,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar3 == 0) {
            psVar17 = (secp256k1_gej *)auStack_278;
            psVar16 = (secp256k1_gej *)0x5;
            iVar3 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)psVar17,5,&modinfo->modulus,1);
            if (iVar3 == 0) goto LAB_00146431;
          }
        }
        goto LAB_001464ff;
      }
    }
LAB_00146431:
    secp256k1_modinv64_normalize_62
              ((secp256k1_modinv64_signed62 *)auStack_1b8,auStack_278._32_8_,modinfo);
    ((secp256k1_fe *)a)->n[4] = auStack_1b8._32_8_;
    ((secp256k1_fe *)a)->n[2] = auStack_1b8._16_8_;
    ((secp256k1_fe *)a)->n[3] = auStack_1b8._24_8_;
    ((secp256k1_fe *)a)->n[0] = auStack_1b8._0_8_;
    ((secp256k1_fe *)a)->n[1] = auStack_1b8._8_8_;
    return;
  }
LAB_001464fa:
  secp256k1_modinv64_cold_16();
LAB_001464ff:
  secp256k1_modinv64_cold_17();
  uVar7 = (ulong)((uint)(psVar16->x).n[0] & 1);
  uVar8 = -uVar7;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar16);
  uVar5 = (psVar16->x).n[1] << 0x3f | (psVar16->x).n[0] >> 1;
  (psVar17->x).n[0] = uVar5 + (uVar8 & 0xdfe92f46681b20a1);
  uVar18 = (psVar16->x).n[2] << 0x3f | (psVar16->x).n[1] >> 1;
  uVar5 = (ulong)CARRY8(uVar8 & 0xdfe92f46681b20a1,uVar5);
  uVar10 = (uVar8 & 0x5d576e7357a4501d) + uVar18;
  bVar29 = CARRY8(uVar8 & 0x5d576e7357a4501d,uVar18) || CARRY8(uVar10,uVar5);
  (psVar17->x).n[1] = uVar10 + uVar5;
  uVar5 = (psVar16->x).n[3] << 0x3f | (psVar16->x).n[2] >> 1;
  (psVar17->x).n[2] = (uVar5 - uVar7) + (ulong)bVar29;
  (psVar17->x).n[3] =
       (uVar8 & 0x7fffffffffffffff) + ((psVar16->x).n[3] >> 1) +
       (ulong)(CARRY8(uVar5,uVar8) || CARRY8(uVar5 + uVar8,(ulong)bVar29));
  secp256k1_scalar_verify((secp256k1_scalar *)psVar17);
  return;
}

Assistant:

static void secp256k1_gej_rescale(secp256k1_gej *r, const secp256k1_fe *s) {
    /* Operations: 4 mul, 1 sqr */
    secp256k1_fe zz;
    SECP256K1_GEJ_VERIFY(r);
    SECP256K1_FE_VERIFY(s);
    VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(s));

    secp256k1_fe_sqr(&zz, s);
    secp256k1_fe_mul(&r->x, &r->x, &zz);                /* r->x *= s^2 */
    secp256k1_fe_mul(&r->y, &r->y, &zz);
    secp256k1_fe_mul(&r->y, &r->y, s);                  /* r->y *= s^3 */
    secp256k1_fe_mul(&r->z, &r->z, s);                  /* r->z *= s   */

    SECP256K1_GEJ_VERIFY(r);
}